

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

AliasRet aa_ahref(jit_State *J,IRIns *refa,IRIns *refb)

{
  IROp1 *pIVar1;
  IRIns *pIVar2;
  AliasRet AVar3;
  IRRef2 IVar4;
  ushort uVar5;
  IRRef2 IVar6;
  ushort uVar7;
  ushort uVar8;
  IRIns *pIVar9;
  IRIns *pIVar10;
  
  AVar3 = ALIAS_MUST;
  if (refa == refb) {
    return ALIAS_MUST;
  }
  uVar5 = (refb->field_0).op2;
  uVar8 = (refa->field_0).op2;
  pIVar2 = (J->cur).ir;
  pIVar10 = pIVar2 + uVar8;
  if ((pIVar10->field_1).o == '\x1e') {
    uVar8 = (pIVar10->field_0).op1;
    pIVar10 = pIVar2 + uVar8;
  }
  pIVar9 = pIVar2 + uVar5;
  if ((pIVar9->field_1).o == '\x1e') {
    uVar5 = (pIVar9->field_0).op1;
    pIVar9 = pIVar2 + uVar5;
  }
  pIVar1 = &(refa->field_1).o;
  if ((*pIVar1 & 0xfe) == 0x38) {
    refa = pIVar2 + (refa->field_0).op1;
  }
  if (((refb->field_1).o & 0xfe) == 0x38) {
    refb = pIVar2 + (refb->field_0).op1;
  }
  if (uVar8 != uVar5) {
    if ((-1 < (short)uVar8) && (-1 < (short)uVar5)) {
      return ALIAS_NO;
    }
    if (*pIVar1 == 0x38) {
      IVar6 = 0;
      uVar7 = uVar8;
      if (((pIVar10->field_1).o == ')') && (-1 < (long)(short)(pIVar10->field_0).op2)) {
        uVar7 = (pIVar10->field_0).op1;
        IVar6 = pIVar2[(short)(pIVar10->field_0).op2].field_1.op12;
        if ((uVar7 == uVar5) && (IVar6 != 0)) {
          return ALIAS_NO;
        }
      }
      IVar4 = 0;
      if (((pIVar9->field_1).o == ')') && (IVar4 = 0, -1 < (long)(short)(pIVar9->field_0).op2)) {
        uVar5 = (pIVar9->field_0).op1;
        IVar4 = pIVar2[(short)(pIVar9->field_0).op2].field_1.op12;
        if ((uVar8 == uVar5) && (IVar4 != 0)) {
          return ALIAS_NO;
        }
      }
      if ((uVar7 == uVar5) && (IVar6 != IVar4)) {
        return ALIAS_NO;
      }
    }
    else if ((((pIVar9->field_1).t.irt ^ (pIVar10->field_1).t.irt) & 0x1f) != 0) {
      return ALIAS_NO;
    }
    AVar3 = ALIAS_MAY;
  }
  if ((refa->field_0).op1 != (refb->field_0).op1) {
    AVar3 = aa_table(J,(uint)(refa->field_0).op1,(uint)(refb->field_0).op1);
    return AVar3;
  }
  return AVar3;
}

Assistant:

static AliasRet aa_ahref(jit_State *J, IRIns *refa, IRIns *refb)
{
  IRRef ka = refa->op2;
  IRRef kb = refb->op2;
  IRIns *keya, *keyb;
  IRRef ta, tb;
  if (refa == refb)
    return ALIAS_MUST;  /* Shortcut for same refs. */
  keya = IR(ka);
  if (keya->o == IR_KSLOT) { ka = keya->op1; keya = IR(ka); }
  keyb = IR(kb);
  if (keyb->o == IR_KSLOT) { kb = keyb->op1; keyb = IR(kb); }
  ta = (refa->o==IR_HREFK || refa->o==IR_AREF) ? IR(refa->op1)->op1 : refa->op1;
  tb = (refb->o==IR_HREFK || refb->o==IR_AREF) ? IR(refb->op1)->op1 : refb->op1;
  if (ka == kb) {
    /* Same key. Check for same table with different ref (NEWREF vs. HREF). */
    if (ta == tb)
      return ALIAS_MUST;  /* Same key, same table. */
    else
      return aa_table(J, ta, tb);  /* Same key, possibly different table. */
  }
  if (irref_isk(ka) && irref_isk(kb))
    return ALIAS_NO;  /* Different constant keys. */
  if (refa->o == IR_AREF) {
    /* Disambiguate array references based on index arithmetic. */
    int32_t ofsa = 0, ofsb = 0;
    IRRef basea = ka, baseb = kb;
    lj_assertJ(refb->o == IR_AREF, "expected AREF");
    /* Gather base and offset from t[base] or t[base+-ofs]. */
    if (keya->o == IR_ADD && irref_isk(keya->op2)) {
      basea = keya->op1;
      ofsa = IR(keya->op2)->i;
      if (basea == kb && ofsa != 0)
	return ALIAS_NO;  /* t[base+-ofs] vs. t[base]. */
    }
    if (keyb->o == IR_ADD && irref_isk(keyb->op2)) {
      baseb = keyb->op1;
      ofsb = IR(keyb->op2)->i;
      if (ka == baseb && ofsb != 0)
	return ALIAS_NO;  /* t[base] vs. t[base+-ofs]. */
    }
    if (basea == baseb && ofsa != ofsb)
      return ALIAS_NO;  /* t[base+-o1] vs. t[base+-o2] and o1 != o2. */
  } else {
    /* Disambiguate hash references based on the type of their keys. */
    lj_assertJ((refa->o==IR_HREF || refa->o==IR_HREFK || refa->o==IR_NEWREF) &&
	       (refb->o==IR_HREF || refb->o==IR_HREFK || refb->o==IR_NEWREF),
	       "bad xREF IR op %d or %d", refa->o, refb->o);
    if (!irt_sametype(keya->t, keyb->t))
      return ALIAS_NO;  /* Different key types. */
  }
  if (ta == tb)
    return ALIAS_MAY;  /* Same table, cannot disambiguate keys. */
  else
    return aa_table(J, ta, tb);  /* Try to disambiguate tables. */
}